

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O3

int AF_AActor_A_Wander(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                      VMReturn *ret,int numret)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar4;
  AActor *self;
  bool bVar5;
  PClass *pPVar3;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_003f50a9;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003f5099:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003f50a9:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0x8ef,
                  "int AF_AActor_A_Wander(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  self = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (self == (AActor *)0x0) goto LAB_003f5063;
    pPVar3 = (self->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar2 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
      pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
      (self->super_DThinker).super_DObject.Class = pPVar3;
    }
    bVar5 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar1 && bVar5) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar5 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar1) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar5) {
      pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003f50a9;
    }
  }
  else {
    if (self != (AActor *)0x0) goto LAB_003f5099;
LAB_003f5063:
    self = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type == '\0') {
LAB_003f5083:
      A_Wander(self,param[1].field_0.i);
      return 0;
    }
    pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
  }
  else {
    if (param[1].field_0.field_3.Type == '\0') goto LAB_003f5083;
    pcVar4 = "(param[paramnum]).Type == REGT_INT";
  }
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                ,0x8f0,"int AF_AActor_A_Wander(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Wander)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF(flags);
	A_Wander(self, flags);
	return 0;
}